

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImU32 ImAlphaBlendColors(ImU32 col_a,ImU32 col_b)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  fVar3 = (float)(col_b >> 0x18) / 255.0;
  uVar1 = col_a >> 8 & 0xff;
  uVar2 = col_a >> 0x10 & 0xff;
  return (int)((float)(int)((col_b >> 8 & 0xff) - uVar1) * fVar3 + (float)uVar1) << 8 |
         (int)((float)(int)((col_b & 0xff) - (col_a & 0xff)) * fVar3 + (float)(col_a & 0xff)) |
         (int)((float)(int)((col_b >> 0x10 & 0xff) - uVar2) * fVar3 + (float)uVar2) << 0x10 |
         0xff000000;
}

Assistant:

IMGUI_API ImU32 ImAlphaBlendColors(ImU32 col_a, ImU32 col_b)
{
    float t = ((col_b >> IM_COL32_A_SHIFT) & 0xFF) / 255.f;
    int r = ImLerp((int)(col_a >> IM_COL32_R_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_R_SHIFT) & 0xFF, t);
    int g = ImLerp((int)(col_a >> IM_COL32_G_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_G_SHIFT) & 0xFF, t);
    int b = ImLerp((int)(col_a >> IM_COL32_B_SHIFT) & 0xFF, (int)(col_b >> IM_COL32_B_SHIFT) & 0xFF, t);
    return IM_COL32(r, g, b, 0xFF);
}